

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O2

int lj_err_unwind_dwarf(int version,int actions,uint64_t uexclass,_Unwind_Exception *uex,
                       _Unwind_Context *ctx)

{
  TValue *pTVar1;
  void *pvVar2;
  GCstr *pGVar3;
  int iVar4;
  code *pcVar5;
  lua_State *L;
  ulong uVar6;
  
  if (version == 1) {
    pvVar2 = (void *)_Unwind_GetCFA(ctx);
    L = (lua_State *)(ulong)*(uint *)((long)pvVar2 + 0x18);
    if ((actions & 1U) == 0) {
      iVar4 = 8;
      if ((actions & 2U) != 0) {
        if ((uexclass ^ 0x4c55414a49543200) < 0x100) {
          uVar6 = uexclass & 0xff;
        }
        else {
          uVar6 = 2;
          if ((actions & 4U) != 0) {
            _Unwind_DeleteException(uex);
          }
        }
        pvVar2 = err_unwind(L,pvVar2,(int)uVar6);
        if ((actions & 8U) == 0) {
          if (pvVar2 == (void *)0x0) {
            if ((actions & 4U) == 0) {
              return 8;
            }
            _Unwind_SetGR(ctx,0,uVar6);
            pcVar5 = lj_vm_unwind_rethrow;
          }
          else {
            _Unwind_SetGR(ctx,0,uVar6);
            pcVar5 = lj_vm_unwind_ff_eh;
            if (((ulong)pvVar2 & 2) == 0) {
              pcVar5 = lj_vm_unwind_c_eh;
            }
          }
          _Unwind_SetIP(ctx,pcVar5);
          iVar4 = 7;
        }
      }
    }
    else {
      pvVar2 = err_unwind(L,pvVar2,0);
      if (pvVar2 == (void *)0x0) {
        iVar4 = 8;
      }
      else {
        iVar4 = 6;
        if (0xff < (uexclass ^ 0x4c55414a49543200)) {
          pTVar1 = L->top;
          L->top = pTVar1 + 1;
          pGVar3 = lj_err_str(L,LJ_ERR_ERRCPP);
          (pTVar1->u32).lo = (uint32_t)pGVar3;
          (pTVar1->field_2).it = 0xfffffffb;
        }
      }
    }
  }
  else {
    iVar4 = 3;
  }
  return iVar4;
}

Assistant:

LJ_FUNCA int lj_err_unwind_dwarf(int version, int actions,
  uint64_t uexclass, _Unwind_Exception *uex, _Unwind_Context *ctx)
{
  void *cf;
  lua_State *L;
  if (version != 1)
    return _URC_FATAL_PHASE1_ERROR;
  UNUSED(uexclass);
  cf = (void *)_Unwind_GetCFA(ctx);
  L = cframe_L(cf);
  if ((actions & _UA_SEARCH_PHASE)) {
#if LJ_UNWIND_EXT
    if (err_unwind(L, cf, 0) == NULL)
      return _URC_CONTINUE_UNWIND;
#endif
    if (!LJ_UEXCLASS_CHECK(uexclass)) {
      setstrV(L, L->top++, lj_err_str(L, LJ_ERR_ERRCPP));
    }
    return _URC_HANDLER_FOUND;
  }
  if ((actions & _UA_CLEANUP_PHASE)) {
    int errcode;
    if (LJ_UEXCLASS_CHECK(uexclass)) {
      errcode = LJ_UEXCLASS_ERRCODE(uexclass);
    } else {
      if ((actions & _UA_HANDLER_FRAME))
	_Unwind_DeleteException(uex);
      errcode = LUA_ERRRUN;
    }
#if LJ_UNWIND_EXT
    cf = err_unwind(L, cf, errcode);
    if ((actions & _UA_FORCE_UNWIND)) {
      return _URC_CONTINUE_UNWIND;
    } else if (cf) {
      _Unwind_SetGR(ctx, LJ_TARGET_EHRETREG, errcode);
      _Unwind_SetIP(ctx, (uintptr_t)(cframe_unwind_ff(cf) ?
				     lj_vm_unwind_ff_eh :
				     lj_vm_unwind_c_eh));
      return _URC_INSTALL_CONTEXT;
    }
#if LJ_TARGET_X86ORX64
    else if ((actions & _UA_HANDLER_FRAME)) {
      /* Workaround for ancient libgcc bug. Still present in RHEL 5.5. :-/
      ** Real fix: http://gcc.gnu.org/viewcvs/trunk/gcc/unwind-dw2.c?r1=121165&r2=124837&pathrev=153877&diff_format=h
      */
      _Unwind_SetGR(ctx, LJ_TARGET_EHRETREG, errcode);
      _Unwind_SetIP(ctx, (uintptr_t)lj_vm_unwind_rethrow);
      return _URC_INSTALL_CONTEXT;
    }
#endif
#else
    /* This is not the proper way to escape from the unwinder. We get away with
    ** it on non-x64 because the interpreter restores all callee-saved regs.
    */
    lj_err_throw(L, errcode);
#endif
  }
  return _URC_CONTINUE_UNWIND;
}